

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void prvTidyAddCharToLexer(Lexer *lexer,uint c)

{
  int iVar1;
  long lVar2;
  int count;
  tmbchar buf [10];
  int local_24;
  undefined8 local_20;
  undefined2 local_18;
  
  local_24 = 0;
  local_18 = 0;
  local_20 = 0;
  iVar1 = prvTidyEncodeCharToUTF8Bytes(c,(tmbstr)&local_20,(TidyOutputSink *)0x0,&local_24);
  if (iVar1 != 0) {
    local_20 = CONCAT53(local_20._3_5_,0xbdbfef);
    local_24 = 3;
  }
  if (0 < local_24) {
    lVar2 = 0;
    do {
      AddByte(lexer,*(tmbchar *)((long)&local_20 + lVar2));
      lVar2 = lVar2 + 1;
    } while (lVar2 < local_24);
  }
  return;
}

Assistant:

void TY_(AddCharToLexer)( Lexer *lexer, uint c )
{
    int i, err, count = 0;
    tmbchar buf[10] = {0};
    
    err = TY_(EncodeCharToUTF8Bytes)( c, buf, NULL, &count );
    if (err)
    {
        /* replacement character 0xFFFD encoded as UTF-8 */
        buf[0] = (byte) 0xEF;
        buf[1] = (byte) 0xBF;
        buf[2] = (byte) 0xBD;
        count = 3;
    }
    
    for ( i = 0; i < count; ++i )
        AddByte( lexer, buf[i] );
}